

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O0

TValue * cploop_opt(lua_State *L,lua_CFunction dummy,void *ud)

{
  jit_State *in_stack_000000c0;
  
  loop_unroll(in_stack_000000c0);
  return (TValue *)0x0;
}

Assistant:

static TValue *cploop_opt(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(L); UNUSED(dummy);
  loop_unroll((jit_State *)ud);
  return NULL;
}